

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O0

void __thiscall cmFindCommon::SetMakefile(cmFindCommon *this,cmMakefile *makefile)

{
  cmMakefile *this_00;
  bool bVar1;
  allocator local_39;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *makefile_local;
  cmFindCommon *this_local;
  
  local_18 = makefile;
  makefile_local = (cmMakefile *)this;
  cmCommand::SetMakefile(&this->super_cmCommand,makefile);
  this_00 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"APPLE",&local_39);
  bVar1 = cmMakefile::IsOn(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (bVar1) {
    this->SearchFrameworkFirst = true;
    this->SearchAppBundleFirst = true;
  }
  return;
}

Assistant:

void cmFindCommon::SetMakefile(cmMakefile* makefile)
{
  cmCommand::SetMakefile(makefile);

  // If we are building for Apple (OSX or also iphone), make sure
  // that frameworks and bundles are searched first.
  if(this->Makefile->IsOn("APPLE"))
    {
    this->SearchFrameworkFirst = true;
    this->SearchAppBundleFirst = true;
    }
}